

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_asn1.cc
# Opt level: O0

ECDSA_SIG * ecdsa_sig_from_fixed(EC_KEY *key,uint8_t *in,size_t len)

{
  uint len_00;
  EC_GROUP *group_00;
  BIGNUM *bn;
  BIGNUM *pBVar1;
  ECDSA_SIG *ret;
  size_t scalar_len;
  EC_GROUP *group;
  size_t len_local;
  uint8_t *in_local;
  EC_KEY *key_local;
  
  group_00 = (EC_GROUP *)EC_KEY_get0_group((EC_KEY *)key);
  if (group_00 == (EC_GROUP *)0x0) {
    ERR_put_error(0x1a,0,0x43,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_asn1.cc"
                  ,0x23);
    key_local = (EC_KEY *)0x0;
  }
  else {
    bn = EC_GROUP_get0_order(group_00);
    len_00 = BN_num_bytes(bn);
    if (len == (ulong)len_00 * 2) {
      key_local = (EC_KEY *)ECDSA_SIG_new();
      if (((key_local == (EC_KEY *)0x0) ||
          (pBVar1 = BN_bin2bn(in,len_00,(BIGNUM *)key_local->group), pBVar1 == (BIGNUM *)0x0)) ||
         (pBVar1 = BN_bin2bn(in + len_00,len_00,(BIGNUM *)key_local->pub_key),
         pBVar1 == (BIGNUM *)0x0)) {
        ECDSA_SIG_free((ECDSA_SIG *)key_local);
        key_local = (EC_KEY *)0x0;
      }
    }
    else {
      ERR_put_error(0x1a,0,100,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_asn1.cc"
                    ,0x28);
      key_local = (EC_KEY *)0x0;
    }
  }
  return (ECDSA_SIG *)key_local;
}

Assistant:

static ECDSA_SIG *ecdsa_sig_from_fixed(const EC_KEY *key, const uint8_t *in,
                                       size_t len) {
  const EC_GROUP *group = EC_KEY_get0_group(key);
  if (group == NULL) {
    OPENSSL_PUT_ERROR(ECDSA, ERR_R_PASSED_NULL_PARAMETER);
    return NULL;
  }
  size_t scalar_len = BN_num_bytes(EC_GROUP_get0_order(group));
  if (len != 2 * scalar_len) {
    OPENSSL_PUT_ERROR(ECDSA, ECDSA_R_BAD_SIGNATURE);
    return NULL;
  }
  ECDSA_SIG *ret = ECDSA_SIG_new();
  if (ret == NULL || !BN_bin2bn(in, scalar_len, ret->r) ||
      !BN_bin2bn(in + scalar_len, scalar_len, ret->s)) {
    ECDSA_SIG_free(ret);
    return NULL;
  }
  return ret;
}